

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

bool ctemplate::Template::ParseDelimiters(char *text,size_t textlen,MarkerDelimiters *delim)

{
  char *__s;
  char *__s_00;
  void *pvVar1;
  void *pvVar2;
  
  pvVar1 = memchr(text,0x20,textlen);
  if (((2 < textlen) && (*text == '=')) && (text[textlen - 1] == '=')) {
    __s = text + 1;
    pvVar2 = memchr(__s,0x3d,textlen - 2);
    if (pvVar1 == (void *)0x0) {
      return false;
    }
    if (pvVar2 != (void *)0x0) {
      return false;
    }
    __s_00 = (char *)((long)pvVar1 + 1);
    pvVar2 = memchr(__s_00,0x20,(size_t)(text + (textlen - (long)__s_00)));
    if (pvVar2 == (void *)0x0) {
      delim->start_marker = __s;
      delim->start_marker_len = (long)pvVar1 - (long)__s;
      delim->end_marker = __s_00;
      delim->end_marker_len = (size_t)(text + ((textlen - 1) - (long)__s_00));
      return true;
    }
  }
  return false;
}

Assistant:

bool Template::ParseDelimiters(const char* text, size_t textlen,
                               MarkerDelimiters* delim) {
  const char* space = (const char*)memchr(text, ' ', textlen);
  if (textlen < 3 ||
      text[0] != '=' || text[textlen - 1] != '=' ||        // no = at ends
      memchr(text + 1, '=', textlen - 2) ||                // = in the middle
      !space ||                                            // no interior space
      memchr(space + 1, ' ', text + textlen - (space+1)))  // too many spaces
    return false;

  delim->start_marker = text + 1;
  delim->start_marker_len = space - delim->start_marker;
  delim->end_marker = space + 1;
  delim->end_marker_len = text + textlen - 1 - delim->end_marker;
  return true;
}